

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

exr_attr_chlist_t * __thiscall Imf_3_4::Context::channels(Context *this,int partidx)

{
  int iVar1;
  element_type *pp_Var2;
  ostream *poVar3;
  char *pcVar4;
  ArgExc *this_00;
  int in_ESI;
  stringstream _iex_throw_s;
  exr_attr_chlist_t *cl;
  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe20;
  stringstream local_1a0 [16];
  ostream local_190 [336];
  Context *in_stack_ffffffffffffffc0;
  exr_attr_chlist_t *local_18;
  int local_c;
  
  local_c = in_ESI;
  pp_Var2 = std::
            __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*(in_stack_fffffffffffffe20);
  iVar1 = exr_get_channels(*pp_Var2,local_c,&local_18);
  if (iVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar3 = std::operator<<(local_190,"Unable to get the channel list for part ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
    poVar3 = std::operator<<(poVar3," in file \'");
    pcVar4 = fileName(in_stack_ffffffffffffffc0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\'");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,local_1a0);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  return local_18;
}

Assistant:

const exr_attr_chlist_t*
Context::channels (int partidx) const
{
    const exr_attr_chlist_t* cl;

    if (EXR_ERR_SUCCESS != exr_get_channels (*_ctxt, partidx, &cl))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to get the channel list for part "
                << partidx << " in file '" << fileName () << "'");
    }

    return cl;
}